

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

CompiledMethod *
Lodtalk::compileMethod
          (VMContext *vmContext,EvaluationScopePtr *scope,Ref<Lodtalk::ClassDescription> *clazz,
          Node *ast)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Behavior *this_00;
  ulong *puVar1;
  int iVar2;
  Oop classBinding;
  undefined4 extraout_var;
  uint uVar3;
  MethodSemanticAnalysis semanticAnalyzer;
  MethodCompiler compiler;
  vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  local_108;
  MethodCompiler local_e8;
  
  this = (scope->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  local_108.
  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*ast->_vptr_Node[2])(ast);
  this_00 = (Behavior *)(clazz->reference).oop.field_0.header;
  if (this_00 != (Behavior *)&NilObject) {
    classBinding = Behavior::getBinding(this_00,vmContext);
    MethodCompiler::MethodCompiler(&local_e8,vmContext,classBinding);
    puVar1 = (ulong *)(clazz->reference).oop.field_0.uintValue;
    if ((((((ulong)puVar1 & 1) == 0) && (uVar3 = (uint)puVar1 & 6, uVar3 != 2)) && (uVar3 != 4)) &&
       ((*puVar1 >> 0x2a == 0x5d || ((uint)(*puVar1 >> 0x2a) == 0x5b)))) {
      MethodAssembler::Assembler::useLongInstanceVariableAccessors(&local_e8.gen);
    }
    iVar2 = (*ast->_vptr_Node[2])(ast,&local_e8);
    local_e8.super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
         (ASTVisitor)&PTR_visitArgument_00163958;
    MethodAssembler::Assembler::~Assembler(&local_e8.gen);
    OopRef::unregisterSelf(&local_e8.classBinding);
    OopRef::unregisterSelf(&local_e8.additionalMethodState.reference);
    OopRef::unregisterSelf(&local_e8.selector);
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::~vector(&local_108);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    return (CompiledMethod *)CONCAT44(extraout_var,iVar2);
  }
  __assert_fail("!isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x3bf,
                "T *Lodtalk::Ref<Lodtalk::ClassDescription>::operator->() const [T = Lodtalk::ClassDescription]"
               );
}

Assistant:

CompiledMethod *compileMethod(VMContext *vmContext, const EvaluationScopePtr &scope, const Ref<ClassDescription> &clazz, Node *ast)
{
    // Perform the semantic analysis
    MethodSemanticAnalysis semanticAnalyzer(vmContext, scope);
    ast->acceptVisitor(&semanticAnalyzer);

    // Generate the actual method
	MethodCompiler compiler(vmContext, clazz->getBinding(vmContext));
    auto classIndex = classIndexOf(clazz.getOop());
    if (classIndex == SMCI_InstructionStream || classIndex == SMCI_Context)
        compiler.useLongInstanceVariableAccessors();

    return reinterpret_cast<CompiledMethod*> (ast->acceptVisitor(&compiler).pointer);
}